

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

string * base64_decode(string *__return_storage_ptr__,string *encoded_string)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  uchar char_array_4 [4];
  uchar char_array_3 [3];
  
  iVar5 = (int)encoded_string->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar9 = 0;
  do {
    uVar7 = 0;
    do {
      bVar11 = iVar5 == 0;
      iVar5 = iVar5 + -1;
      if (bVar11) {
LAB_0016a27a:
        if (uVar7 != 0) {
          uVar10 = 0;
          uVar6 = 0;
          if (0 < (int)uVar7) {
            uVar6 = (ulong)uVar7;
          }
          for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
            uVar2 = std::__cxx11::string::find(-0x18,(ulong)(uint)(int)(char)char_array_4[uVar10]);
            char_array_4[uVar10] = uVar2;
          }
          uVar8 = 1;
          if (1 < (int)uVar7) {
            uVar8 = uVar7;
          }
          for (uVar6 = 0; uVar8 - 1 != uVar6; uVar6 = uVar6 + 1) {
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
          }
        }
        return __return_storage_ptr__;
      }
      bVar1 = (encoded_string->_M_dataplus)._M_p[lVar9];
      if ((bVar1 == 0x3d) ||
         ((iVar3 = isalnum((uint)bVar1), (bVar1 & 0xfb) != 0x2b && (iVar3 == 0))))
      goto LAB_0016a27a;
      lVar4 = (long)(int)uVar7;
      uVar7 = uVar7 + 1;
      char_array_4[lVar4] = bVar1;
      lVar9 = lVar9 + 1;
    } while (uVar7 != 4);
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      uVar2 = std::__cxx11::string::find(-0x18,(ulong)(uint)(int)(char)char_array_4[lVar4]);
      char_array_4[lVar4] = uVar2;
    }
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  } while( true );
}

Assistant:

std::string base64_decode(std::string const& encoded_string) {
  int in_len = encoded_string.size();
  int i = 0;
  int j = 0;
  int in_ = 0;
  unsigned char char_array_4[4], char_array_3[3];
  std::string ret;

  while (in_len-- && ( encoded_string[in_] != '=') && is_base64(encoded_string[in_])) {
    char_array_4[i++] = encoded_string[in_]; in_++;
    if (i ==4) {
      for (i = 0; i <4; i++)
        char_array_4[i] = base64_chars.find(char_array_4[i]);

      char_array_3[0] = ( char_array_4[0] << 2       ) + ((char_array_4[1] & 0x30) >> 4);
      char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
      char_array_3[2] = ((char_array_4[2] & 0x3) << 6) +   char_array_4[3];

      for (i = 0; (i < 3); i++)
        ret += char_array_3[i];
      i = 0;
    }
  }

  if (i) {
    for (j = 0; j < i; j++)
      char_array_4[j] = base64_chars.find(char_array_4[j]);

    char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
    char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);

    for (j = 0; (j < i - 1); j++) ret += char_array_3[j];
  }

  return ret;
}